

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::clear(MidiFile *this)

{
  pointer p_Var1;
  MidiEventList *pMVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = (uint)((ulong)((long)(this->m_events).
                               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar4) {
    uVar3 = 0;
    do {
      pMVar2 = (this->m_events).
               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar3];
      if (pMVar2 != (MidiEventList *)0x0) {
        MidiEventList::~MidiEventList(pMVar2);
        operator_delete(pMVar2);
      }
      (this->m_events).
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (MidiEventList *)0x0;
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,1);
  pMVar2 = (MidiEventList *)operator_new(0x18);
  MidiEventList::MidiEventList(pMVar2);
  *(this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
   _M_impl.super__Vector_impl_data._M_start = pMVar2;
  this->m_timemapvalid = false;
  p_Var1 = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var1) {
    (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
    super__Vector_impl_data._M_finish = p_Var1;
  }
  this->m_theTrackState = 0;
  this->m_theTimeState = 1;
  return;
}

Assistant:

void MidiFile::clear(void) {
	int length = getNumTracks();
	for (int i=0; i<length; i++) {
		delete m_events[i];
		m_events[i] = NULL;
	}
	m_events.resize(1);
	m_events[0] = new MidiEventList;
	m_timemapvalid=0;
	m_timemap.clear();
	m_theTrackState = TRACK_STATE_SPLIT;
	m_theTimeState = TIME_STATE_ABSOLUTE;
}